

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkMeanImage::SerializeWithCachedSizes
          (NeuralNetworkMeanImage *this,CodedOutputStream *output)

{
  int iVar1;
  RepeatedField<float> *this_00;
  float *a;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  NeuralNetworkMeanImage *this_local;
  
  iVar1 = meanimage_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_meanimage_cached_byte_size_);
    this_00 = meanimage(this);
    a = google::protobuf::RepeatedField<float>::data(this_00);
    iVar1 = meanimage_size(this);
    google::protobuf::internal::WireFormatLite::WriteFloatArray(a,iVar1,output);
  }
  return;
}

Assistant:

void NeuralNetworkMeanImage::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NeuralNetworkMeanImage)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float meanImage = 1;
  if (this->meanimage_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_meanimage_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->meanimage().data(), this->meanimage_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NeuralNetworkMeanImage)
}